

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ReplaceString(string *source,char *replace,size_t replaceSize,string *with)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined8 local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined8 local_50;
  char *local_48;
  char *currentPos;
  char *orig;
  char *searchPos;
  char *src;
  string *with_local;
  size_t replaceSize_local;
  char *replace_local;
  string *source_local;
  
  src = (char *)with;
  with_local = (string *)replaceSize;
  replaceSize_local = (size_t)replace;
  replace_local = (char *)source;
  searchPos = (char *)std::__cxx11::string::c_str();
  orig = strstr(searchPos,(char *)replaceSize_local);
  if (orig != (char *)0x0) {
    local_48 = strdup(searchPos);
    pcVar1 = replace_local;
    orig = local_48 + ((long)orig - (long)searchPos);
    currentPos = local_48;
    local_58._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_50,&local_58);
    local_68._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_60,&local_68);
    std::__cxx11::string::erase(pcVar1,local_50,local_60);
    do {
      *orig = '\0';
      std::__cxx11::string::operator+=((string *)replace_local,local_48);
      local_48 = orig + (long)with_local;
      std::__cxx11::string::operator+=((string *)replace_local,(string *)src);
      orig = strstr(local_48,(char *)replaceSize_local);
    } while (orig != (char *)0x0);
    std::__cxx11::string::operator+=((string *)replace_local,local_48);
    free(currentPos);
  }
  return;
}

Assistant:

void SystemTools::ReplaceString(std::string& source, const char* replace,
                                size_t replaceSize, const std::string& with)
{
  const char* src = source.c_str();
  char* searchPos = const_cast<char*>(strstr(src, replace));

  // get out quick if string is not found
  if (!searchPos) {
    return;
  }

  // perform replacements until done
  char* orig = strdup(src);
  char* currentPos = orig;
  searchPos = searchPos - src + orig;

  // initialize the result
  source.erase(source.begin(), source.end());
  do {
    *searchPos = '\0';
    source += currentPos;
    currentPos = searchPos + replaceSize;
    // replace
    source += with;
    searchPos = strstr(currentPos, replace);
  } while (searchPos);

  // copy any trailing text
  source += currentPos;
  free(orig);
}